

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parseConst.cpp
# Opt level: O1

bool __thiscall
glslang::TConstTraverser::visitAggregate
          (TConstTraverser *this,TVisit param_1,TIntermAggregate *node)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *plVar4;
  long lVar5;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined8 *puVar6;
  
  bVar1 = TIntermOperator::isConstructor(&node->super_TIntermOperator);
  if ((bVar1) || ((node->super_TIntermOperator).op == EOpComma)) {
    iVar3 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
              [0x32])(node);
    if (*(long *)(CONCAT44(extraout_var,iVar3) + 0x10) - *(long *)(CONCAT44(extraout_var,iVar3) + 8)
        == 8) {
      iVar3 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
                [0x32])(node);
      plVar4 = (long *)(**(code **)(*(long *)**(undefined8 **)(CONCAT44(extraout_var_00,iVar3) + 8)
                                   + 0x18))();
      lVar5 = (**(code **)(*plVar4 + 0x28))(plVar4);
      bVar1 = lVar5 != 0;
    }
    else {
      bVar1 = false;
    }
    if (bVar1) {
      this->singleConstantParam = true;
      this->constructorType = (node->super_TIntermOperator).op;
      iVar3 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
                [0x1e])(node);
      iVar3 = TType::computeNumComponents((TType *)CONCAT44(extraout_var_01,iVar3));
      this->size = iVar3;
      iVar3 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
                [0x1e])(node);
      cVar2 = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar3) + 0xe0))
                        ((long *)CONCAT44(extraout_var_02,iVar3));
      if (cVar2 != '\0') {
        this->isMatrix = true;
        iVar3 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x1e])(node);
        iVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar3) + 0x68))
                          ((long *)CONCAT44(extraout_var_03,iVar3));
        this->matrixCols = iVar3;
        iVar3 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x1e])(node);
        iVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar3) + 0x70))
                          ((long *)CONCAT44(extraout_var_04,iVar3));
        this->matrixRows = iVar3;
      }
    }
    iVar3 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
              [0x32])(node);
    puVar6 = *(undefined8 **)(CONCAT44(extraout_var_05,iVar3) + 8);
    while( true ) {
      iVar3 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
                [0x32])(node);
      if (puVar6 == *(undefined8 **)(CONCAT44(extraout_var_06,iVar3) + 0x10)) break;
      if ((node->super_TIntermOperator).op == EOpComma) {
        this->index = 0;
      }
      (**(code **)(*(long *)*puVar6 + 0x10))((long *)*puVar6,this);
      puVar6 = puVar6 + 1;
    }
    if (bVar1) {
      this->singleConstantParam = false;
      this->constructorType = EOpNull;
      this->size = 0;
      this->isMatrix = false;
      this->matrixCols = 0;
      this->matrixRows = 0;
    }
  }
  else {
    this->error = true;
  }
  return false;
}

Assistant:

bool TConstTraverser::visitAggregate(TVisit /* visit */, TIntermAggregate* node)
{
    if (! node->isConstructor() && node->getOp() != EOpComma) {
        error = true;

        return false;
    }

    bool flag = node->getSequence().size() == 1 && node->getSequence()[0]->getAsTyped()->getAsConstantUnion();
    if (flag) {
        singleConstantParam = true;
        constructorType = node->getOp();
        size = node->getType().computeNumComponents();

        if (node->getType().isMatrix()) {
            isMatrix = true;
            matrixCols = node->getType().getMatrixCols();
            matrixRows = node->getType().getMatrixRows();
        }
    }

    for (TIntermSequence::iterator p = node->getSequence().begin();
                                   p != node->getSequence().end(); p++) {

        if (node->getOp() == EOpComma)
            index = 0;

        (*p)->traverse(this);
    }
    if (flag)
    {
        singleConstantParam = false;
        constructorType = EOpNull;
        size = 0;
        isMatrix = false;
        matrixCols = 0;
        matrixRows = 0;
    }

    return false;
}